

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::EntryPointInfo::RecordNativeMap(EntryPointInfo *this,uint32 nativeOffset,uint32 statementIndex)

{
  int iVar1;
  uint32 uVar2;
  NativeEntryPointData *pNVar3;
  Type *pTVar4;
  Type *this_00;
  NativeOffsetMap local_2c;
  
  pNVar3 = GetNativeEntryPointData(this);
  iVar1 = (pNVar3->nativeOffsetMaps).
          super_ReadOnlyList<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_DefaultComparer>
          .count;
  this_00 = &pNVar3->nativeOffsetMaps;
  if (iVar1 != 0) {
    pTVar4 = JsUtil::
             List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item(this_00,iVar1 + -1);
    uVar2 = (pTVar4->nativeOffsetSpan).begin;
    if (uVar2 == (pTVar4->nativeOffsetSpan).end) {
      if (pTVar4->statementIndex == statementIndex) {
        return;
      }
      if (uVar2 == nativeOffset) {
        if (statementIndex != 0xffffffff) {
          pTVar4->statementIndex = statementIndex;
          return;
        }
        JsUtil::
        List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::RemoveAtEnd(this_00);
        return;
      }
      (pTVar4->nativeOffsetSpan).end = nativeOffset;
    }
  }
  if (statementIndex != 0xffffffff) {
    local_2c.statementIndex = statementIndex;
    local_2c.nativeOffsetSpan.begin = nativeOffset;
    local_2c.nativeOffsetSpan.end = nativeOffset;
    JsUtil::
    List<NativeEntryPointData::NativeOffsetMap,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Add(this_00,&local_2c);
  }
  return;
}

Assistant:

void
    EntryPointInfo::RecordNativeMap(uint32 nativeOffset, uint32 statementIndex)
    {
        auto& nativeOffsetMaps = this->GetNativeEntryPointData()->GetNativeOffsetMaps();
        int count = nativeOffsetMaps.Count();
        if (count)
        {
            NativeEntryPointData::NativeOffsetMap* previous = &nativeOffsetMaps.Item(count-1);
            // Check if the range is still not finished.
            if (previous->nativeOffsetSpan.begin == previous->nativeOffsetSpan.end)
            {
                if (previous->statementIndex == statementIndex)
                {
                    // If the statement index is the same, we can continue with the previous range
                    return;
                }

                // If the range is empty, replace the previous range.
                if ((uint32)previous->nativeOffsetSpan.begin == nativeOffset)
                {
                    if (statementIndex == Js::Constants::NoStatementIndex)
                    {
                        nativeOffsetMaps.RemoveAtEnd();
                    }
                    else
                    {
                        previous->statementIndex = statementIndex;
                    }
                    return;
                }

                // Close the previous range
                previous->nativeOffsetSpan.end = nativeOffset;
            }
        }

        if (statementIndex == Js::Constants::NoStatementIndex)
        {
            // We do not explicitly record the offsets that do not map to user code.
            return;
        }

        NativeEntryPointData::NativeOffsetMap map;
        map.statementIndex = statementIndex;
        map.nativeOffsetSpan.begin = nativeOffset;
        map.nativeOffsetSpan.end = nativeOffset;

        nativeOffsetMaps.Add(map);
    }